

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool __thiscall
vkt::tessellation::anon_unknown_0::LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::
operator()(LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *this,Vector<float,_3> *a,
          Vector<float,_3> *b)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  int local_2c;
  int i;
  Vector<float,_3> *b_local;
  Vector<float,_3> *a_local;
  LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *this_local;
  
  local_2c = 0;
  while( true ) {
    if (2 < local_2c) {
      return false;
    }
    pfVar2 = tcu::Vector<float,_3>::operator[](a,local_2c);
    pfVar3 = tcu::Vector<float,_3>::operator[](b,local_2c);
    bVar1 = std::less<float>::operator()((less<float> *)this,pfVar2,pfVar3);
    if (bVar1) break;
    pfVar2 = tcu::Vector<float,_3>::operator[](b,local_2c);
    pfVar3 = tcu::Vector<float,_3>::operator[](a,local_2c);
    bVar1 = std::less<float>::operator()((less<float> *)this,pfVar2,pfVar3);
    if (bVar1) {
      return false;
    }
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool operator() (const SeqT& a, const SeqT& b) const
	{
		for (int i = 0; i < Size; ++i)
		{
			if (m_pred(a[i], b[i]))
				return true;
			if (m_pred(b[i], a[i]))
				return false;
		}
		return false;
	}